

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

void __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 in_RAX;
  undefined4 *puVar4;
  uint uVar5;
  ulong dwSize;
  DWORD local_14 [2];
  DWORD oldProtect;
  
  local_14[0] = (DWORD)((ulong)in_RAX >> 0x20);
  uVar5 = (uint)(0x8000 % this->objectSize);
  if (0xfff < uVar5) {
    dwSize = (ulong)(uVar5 & 0xf000);
    BVar3 = VirtualProtect((this->super_HeapBlock).address + (0x8000 - dwSize),dwSize,2,local_14);
    if ((BVar3 == 0) || (local_14[0] != 4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                         ,0xc3,"(ret && oldProtect == 0x04)","ret && oldProtect == PAGE_READWRITE");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
  }
  return;
}

Assistant:

void
SmallHeapBlockT<MediumAllocationBlockAttributes>::ProtectUnusablePages()
{
    size_t count = this->GetUnusablePageCount();
    if (count > 0)
    {
        char* startPage = this->address + (MediumAllocationBlockAttributes::PageCount - count) * AutoSystemInfo::PageSize;
        DWORD oldProtect;
        BOOL ret = ::VirtualProtect(startPage, count * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect);
        Assert(ret && oldProtect == PAGE_READWRITE);
#ifdef RECYCLER_WRITE_WATCH
        if (!CONFIG_FLAG(ForceSoftwareWriteBarrier))
        {
            ::ResetWriteWatch(startPage, count*AutoSystemInfo::PageSize);
        }
#endif
    }
}